

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

bool __thiscall BasePort::WriteAllBoardsBroadcast(BasePort *this)

{
  uchar *puVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  char *pcVar12;
  BoardIO *pBVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  ostream *poVar17;
  quadlet_t ctrl;
  long *local_50 [2];
  long local_40 [2];
  
  iVar5 = (*this->_vptr_BasePort[0x11])();
  if ((char)iVar5 == '\0') {
    poVar17 = this->outStr;
    pcVar12 = "BasePort::WriteAllBoardsBroadcast: port not initialized";
    lVar10 = 0x37;
  }
  else {
    if (((this->IsAllBoardsRev4_6_ != false) || (this->IsAllBoardsRev7_ != false)) ||
       (this->IsAllBoardsRev8_9_ != false)) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"WriteAllBoardsBroadcast","");
      iVar5 = (*this->_vptr_BasePort[0x1b])(this,(string *)local_50,(ulong)this->autoReScan);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      uVar16 = 0;
      if ((char)iVar5 != '\0') {
        puVar1 = this->WriteBufferBroadcast;
        uVar6 = (*this->_vptr_BasePort[0x17])(this);
        uVar7 = (*this->_vptr_BasePort[0x14])(this,2);
        if (this->max_board != 0) {
          uVar15 = 0;
          uVar16 = 0;
          do {
            if (this->BoardList[uVar15] != (BoardIO *)0x0) {
              uVar8 = (*this->BoardList[uVar15]->_vptr_BoardIO[3])();
              uVar2 = uVar8 - 4;
              if (this->IsAllBoardsRev4_6_ == false) {
                uVar2 = uVar8;
              }
              (*this->BoardList[uVar15]->_vptr_BoardIO[4])
                        (this->BoardList[uVar15],
                         puVar1 + (ulong)uVar7 + (ulong)uVar6 +
                         ((long)(int)uVar16 & 0xfffffffffffffffc),0,uVar2 >> 2,1);
              uVar16 = (ulong)((int)uVar16 + uVar2);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < this->max_board);
        }
        iVar5 = (*this->_vptr_BasePort[0x28])(this,puVar1 + (ulong)uVar7 + (ulong)uVar6,uVar16);
        if (this->max_board == 0) {
          bVar3 = true;
          uVar16 = 1;
        }
        else {
          uVar16 = 1;
          uVar15 = 0;
          bVar3 = true;
          do {
            pBVar13 = this->BoardList[uVar15];
            if (pBVar13 != (BoardIO *)0x0) {
              bVar11 = SUB41(iVar5,0);
              if (this->FirmwareVersion[uVar15] < 7) {
                uVar6 = (*pBVar13->_vptr_BoardIO[3])();
                (*this->BoardList[uVar15]->_vptr_BoardIO[4])
                          (this->BoardList[uVar15],local_50,(ulong)((uVar6 >> 2) - 1),1,0);
                if ((int)local_50[0] == 0) {
                  bVar4 = 1;
                  bVar14 = 1;
                }
                else {
                  iVar9 = (*this->_vptr_BasePort[0x24])(this,uVar15 & 0xff,0);
                  bVar14 = (byte)iVar9;
                  if (bVar14 == 0) {
                    uVar16 = 0;
                  }
                  else {
                    bVar3 = false;
                  }
                  bVar4 = bVar14 ^ 1;
                }
                if (((bVar4 != 0) &&
                    (iVar9 = (*this->BoardList[uVar15]->_vptr_BoardIO[6])(), (char)iVar9 == '\0'))
                   && (iVar9 = (*this->_vptr_BasePort[0x25])(this,uVar15 & 0xff),
                      (char)iVar9 != '\0')) {
                  bVar3 = false;
                }
                pBVar13 = this->BoardList[uVar15];
                pBVar13->writeValid = (bool)(bVar14 & bVar11);
                if ((bool)(bVar14 & bVar11) == false) {
LAB_0010e251:
                  pBVar13->numWriteErrors = pBVar13->numWriteErrors + 1;
                }
                (*pBVar13->_vptr_BoardIO[5])();
              }
              else {
                pBVar13->writeValid = bVar11;
                if (bVar11 == false) goto LAB_0010e251;
                (*pBVar13->_vptr_BoardIO[5])();
                (*this->BoardList[uVar15]->_vptr_BoardIO[7])();
                bVar3 = false;
              }
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < this->max_board);
        }
        if (!bVar3) {
          return SUB81(uVar16,0);
        }
      }
      goto LAB_0010e2b0;
    }
    poVar17 = this->outStr;
    pcVar12 = "BasePort::WriteAllBoardsBroadcast: invalid mix of firmware";
    lVar10 = 0x3a;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar12,lVar10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  uVar16 = 0;
LAB_0010e2b0:
  (*this->_vptr_BasePort[9])(this);
  return SUB81(uVar16,0);
}

Assistant:

bool BasePort::WriteAllBoardsBroadcast(void)
{
    if (!IsOK()) {
        outStr << "BasePort::WriteAllBoardsBroadcast: port not initialized" << std::endl;
        OnNoneWritten();
        return false;
    }

    if (!IsBroadcastFirmwareMixValid()) {
        outStr << "BasePort::WriteAllBoardsBroadcast: invalid mix of firmware" << std::endl;
        OnNoneWritten();
        return false;
    }

    if (!CheckFwBusGeneration("WriteAllBoardsBroadcast", autoReScan)) {
        OnNoneWritten();
        return false;
    }

    bool rtWrite = true;   // for debugging

    // sanity check vars
    bool allOK = true;
    bool noneWritten = true;

    // construct broadcast write buffer
    quadlet_t *bcBuffer = reinterpret_cast<quadlet_t *>(WriteBufferBroadcast + GetWriteQuadAlign() + GetPrefixOffset(WR_FW_BDATA));

    int bcBufferOffset = 0; // the offset for new data to be stored in bcBuffer (bytes)
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            unsigned int numBytes = BoardList[board]->GetWriteNumBytes();
            quadlet_t *bcPtr = bcBuffer+bcBufferOffset/sizeof(quadlet_t);
            if (IsAllBoardsRev4_6_) {
                numBytes -= sizeof(quadlet_t);   // for ctrl offset
                unsigned int numQuads = numBytes/4;
                BoardList[board]->GetWriteData(bcPtr, 0, numQuads);
            }
            else {
                unsigned int numQuads = numBytes/4;
                BoardList[board]->GetWriteData(bcPtr, 0, numQuads);
            }
            // bcBufferOffset equals total numBytes to write, when the loop ends
            bcBufferOffset = bcBufferOffset + numBytes;
        }
    }

    // now broadcast out the huge packet
    bool ret;

    ret = WriteBroadcastOutput(bcBuffer, bcBufferOffset);

    // Send out control quadlet if necessary (firmware prior to Rev 7);
    //    also check for data collection
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            if (FirmwareVersion[board] < 7) {
                bool noneWrittenThisBoard = true;
                unsigned int numBytes = BoardList[board]->GetWriteNumBytes();
                // Get last quadlet (false -> no byteswapping)
                quadlet_t ctrl;
                BoardList[board]->GetWriteData(&ctrl, (numBytes/sizeof(quadlet_t))-1, 1, false);
                bool ret2 = true;
                if (ctrl) {  // if anything non-zero, write it
                    ret2 = WriteQuadlet(board, 0x00, ctrl);
                    if (ret2) { noneWritten = false; noneWrittenThisBoard = false; }
                    else allOK = false;
                }
                if (noneWrittenThisBoard
                    && !(BoardList[board]->WriteBufferResetsWatchdog())) {
                    // send no-op to reset watchdog
                    bool ret3 = WriteNoOp(board);
                    if (ret3) noneWritten = false;
                }
                BoardList[board]->SetWriteValid(ret&&ret2);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
            }
            else {
                BoardList[board]->SetWriteValid(ret);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
                if (ret) {
                    noneWritten = false;
                    // Check for data collection callback
                    BoardList[board]->CheckCollectCallback();
                }
            }
        }
    }

    if (noneWritten) {
        OnNoneWritten();
    }
    if (!rtWrite)
        outStr << "BasePort::WriteAllBoardsBroadcast: rtWrite is false" << std::endl;

    // return
    return allOK;
}